

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirectorySnapshot.cpp
# Opt level: O2

void __thiscall
efsw::DirectorySnapshot::deleteAll(DirectorySnapshot *this,DirectorySnapshotDiff *Diff)

{
  bool bVar1;
  _Base_ptr p_Var2;
  DirectorySnapshotDiff *this_00;
  _Self __tmp;
  FileInfo fi;
  FileInfo FStack_78;
  
  FileInfo::FileInfo(&FStack_78);
  for (p_Var2 = (this->Files)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->Files)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    FileInfo::operator=(&FStack_78,(FileInfo *)(p_Var2 + 2));
    bVar1 = FileInfo::isDirectory(&FStack_78);
    this_00 = Diff;
    if (bVar1) {
      this_00 = (DirectorySnapshotDiff *)&Diff->DirsDeleted;
    }
    std::vector<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>::push_back
              (&this_00->FilesDeleted,&FStack_78);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
  ::clear(&(this->Files)._M_t);
  std::__cxx11::string::~string((string *)&FStack_78);
  return;
}

Assistant:

void DirectorySnapshot::deleteAll( DirectorySnapshotDiff& Diff ) {
	FileInfo fi;

	for ( FileInfoMap::iterator it = Files.begin(); it != Files.end(); it++ ) {
		fi = it->second;

		if ( fi.isDirectory() ) {
			Diff.DirsDeleted.push_back( fi );
		} else {
			Diff.FilesDeleted.push_back( fi );
		}
	}

	Files.clear();
}